

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O3

void nop_1e(PDISASM pMyDisasm)

{
  ulong uVar1;
  char *pcVar2;
  UInt8 UVar3;
  UIntPtr UVar4;
  ulong uVar5;
  int iVar6;
  undefined8 uVar7;
  uint uVar8;
  uint uVar9;
  
  if ((pMyDisasm->Reserved_).VEX.state != '\x01') {
    if ((pMyDisasm->Reserved_).PrefRepe != 1) {
      (pMyDisasm->Instruction).Category = 0x1000c;
      builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"hint_nop",9);
      iVar6 = (pMyDisasm->Reserved_).OperandSize;
      uVar9 = 0x68;
      if (iVar6 != 0x40) {
        uVar9 = iVar6 == 0x20 | 0x66;
      }
      (pMyDisasm->Reserved_).MemDecoration = uVar9;
      decodeModrm(&pMyDisasm->Operand2,pMyDisasm);
      (pMyDisasm->Operand1).AccessMode = 1;
      (pMyDisasm->Reserved_).EIP_ =
           (pMyDisasm->Reserved_).EIP_ + (ulong)((pMyDisasm->Reserved_).DECALAGE_EIP + 2);
      return;
    }
    UVar4 = (pMyDisasm->Reserved_).EIP_;
    uVar5 = (pMyDisasm->Reserved_).EndOfBlock;
    uVar1 = UVar4 + 2;
    if (uVar5 < uVar1 && uVar5 != 0) {
LAB_0011a63e:
      (pMyDisasm->Reserved_).OutOfBlock = 1;
      (pMyDisasm->Reserved_).ERROR_OPCODE = -2;
      return;
    }
    uVar9 = *(byte *)(UVar4 + 1) >> 3 & 7;
    (pMyDisasm->Reserved_).REGOPCODE = uVar9;
    if (uVar9 == 7) {
      (pMyDisasm->Prefix).RepPrefix = '\b';
      if (uVar5 < uVar1 && uVar5 != 0) goto LAB_0011a63e;
      uVar8 = (uint)(*(byte *)(UVar4 + 1) >> 6);
      (pMyDisasm->Reserved_).MOD_ = uVar8;
      uVar9 = *(byte *)(UVar4 + 1) & 7;
      (pMyDisasm->Reserved_).RM_ = uVar9;
      if (uVar8 == 3) {
        if ((char)uVar9 == '\x03') {
          (pMyDisasm->Instruction).Category = 0x170000;
          uVar7 = 0x32337262646e65;
        }
        else {
          if (uVar9 != 2) {
            return;
          }
          (pMyDisasm->Instruction).Category = 0x170000;
          uVar7 = 0x34367262646e65;
        }
        *(undefined8 *)(pMyDisasm->Instruction).Mnemonic = uVar7;
        (pMyDisasm->Reserved_).EIP_ = UVar4 + ((pMyDisasm->Reserved_).DECALAGE_EIP + 2);
        return;
      }
    }
    else if (uVar9 == 1) {
      (pMyDisasm->Prefix).RepPrefix = '\b';
      (pMyDisasm->Instruction).Category = 0x170000;
      if (uVar5 < uVar1 && uVar5 != 0) goto LAB_0011a63e;
      uVar9 = (uint)(*(byte *)(UVar4 + 1) >> 6);
      (pMyDisasm->Reserved_).MOD_ = uVar9;
      if (uVar9 == 3) {
        UVar3 = (pMyDisasm->Reserved_).REX.W_;
        pcVar2 = (pMyDisasm->Instruction).Mnemonic;
        if (UVar3 == '\x01' && (pMyDisasm->Reserved_).REX.state == '\x01') {
          builtin_strncpy(pcVar2,"rdsspq",7);
          iVar6 = 0x40;
        }
        else {
          builtin_strncpy(pcVar2,"rdsspd",7);
          iVar6 = (uint)(UVar3 == '\x01') * 0x20 + 0x20;
        }
        (pMyDisasm->Reserved_).OperandSize = iVar6;
        decodeModrm(&pMyDisasm->Operand1,pMyDisasm);
        (pMyDisasm->Operand2).OpType = 0x20000;
        (pMyDisasm->Operand2).OpSize = 0x40;
        (pMyDisasm->Operand2).Registers.type = 0x20;
        (pMyDisasm->Operand2).Registers.special = 4;
        return;
      }
    }
  }
  builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"???",4);
  (pMyDisasm->Operand1).AccessMode = 0;
  (pMyDisasm->Operand2).AccessMode = 0;
  (pMyDisasm->Operand3).AccessMode = 0;
  (pMyDisasm->Operand4).AccessMode = 0;
  (pMyDisasm->Operand5).AccessMode = 0;
  (pMyDisasm->Operand6).AccessMode = 0;
  (pMyDisasm->Operand7).AccessMode = 0;
  (pMyDisasm->Operand8).AccessMode = 0;
  (pMyDisasm->Operand9).AccessMode = 0;
  (pMyDisasm->Reserved_).ERROR_OPCODE = -1;
  return;
}

Assistant:

void __bea_callspec__ nop_1e(PDISASM pMyDisasm)
{
  if (GV.VEX.state == InUsePrefix) {
    failDecode(pMyDisasm);
    return;
  }
  else if (GV.PrefRepe == 1) {
    /* ======= prefix f3 ========= */
    if (!Security(2, pMyDisasm)) return;
    GV.REGOPCODE = ((*((UInt8*) (GV.EIP_+1))) >> 3) & 0x7;
    if (GV.REGOPCODE == 1) {
      pMyDisasm->Prefix.RepPrefix = MandatoryPrefix;
      pMyDisasm->Instruction.Category = CET_INSTRUCTION;
      if (!Security(2, pMyDisasm)) return;
      GV.MOD_= ((*((UInt8*) (GV.EIP_+1))) >> 6) & 0x3;
      if (GV.MOD_ != 0x3) { failDecode(pMyDisasm); return; }
      if ((GV.REX.state == InUsePrefix) && (GV.REX.W_ == 1)) {
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy (pMyDisasm->Instruction.Mnemonic, "rdsspq");
        #endif
      }
      else {
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy (pMyDisasm->Instruction.Mnemonic, "rdsspd");
        #endif
      }
      GV.OperandSize = (GV.REX.W_ == 1) ? 64 : 32;
      decodeModrm(&pMyDisasm->Operand1, pMyDisasm);
      pMyDisasm->Operand2.OpType = REGISTER_TYPE;
      pMyDisasm->Operand2.OpSize = 64;
      pMyDisasm->Operand2.Registers.type = SPECIAL_REG;
      pMyDisasm->Operand2.Registers.special = REG2; /* SSP reg */
    }
    else if (GV.REGOPCODE == 7) {
      pMyDisasm->Prefix.RepPrefix = MandatoryPrefix;
      if (!Security(2, pMyDisasm)) return;
      GV.MOD_= ((*((UInt8*) (GV.EIP_+1))) >> 6) & 0x3;
      GV.RM_  = (*((UInt8*) (GV.EIP_+1))) & 0x7;
      if (GV.MOD_ != 0x3) { failDecode(pMyDisasm); return; }
      if (GV.RM_ == 0x2) {
        pMyDisasm->Instruction.Category = CET_INSTRUCTION;
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy (pMyDisasm->Instruction.Mnemonic, "endbr64");
        #endif
        GV.EIP_+= GV.DECALAGE_EIP+2;
      }
      else if (GV.RM_ == 0x3) {
        pMyDisasm->Instruction.Category = CET_INSTRUCTION;
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy (pMyDisasm->Instruction.Mnemonic, "endbr32");
        #endif
        GV.EIP_+= GV.DECALAGE_EIP+2;
      }
    }
    else {
      failDecode(pMyDisasm);
    }
  }
  else {
    pMyDisasm->Instruction.Category = GENERAL_PURPOSE_INSTRUCTION+MISCELLANEOUS_INSTRUCTION;
    #ifndef BEA_LIGHT_DISASSEMBLY
       (void) strcpy (pMyDisasm->Instruction.Mnemonic, "hint_nop");
    #endif
    if (GV.OperandSize == 64) {
      GV.MemDecoration = Arg2qword;
    }
    else if (GV.OperandSize == 32) {
      GV.MemDecoration = Arg2dword;
    }
    else {
      GV.MemDecoration = Arg2word;
    }
    decodeModrm(&pMyDisasm->Operand2, pMyDisasm);
    pMyDisasm->Operand1.AccessMode = READ;
    GV.EIP_ += GV.DECALAGE_EIP+2;
  }
}